

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_new_connection_id_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  uint8_t *puVar1;
  byte *pbVar2;
  long lVar3;
  bool bVar4;
  uint64_t uVar5;
  size_t sVar6;
  int iVar7;
  uint64_t uVar8;
  char *pcVar9;
  char *pcVar10;
  ulong in_RCX;
  byte *extraout_RDX;
  byte *extraout_RDX_00;
  byte *cid;
  uint64_t *buf;
  byte *in_R8;
  uint64_t in_R9;
  ulong uVar11;
  undefined8 auStack_c0 [3];
  char acStack_a8 [40];
  undefined8 uStack_80;
  uint64_t local_78;
  uint64_t unregistered_seqs [4];
  ulong local_48;
  size_t num_unregistered_seqs;
  size_t _l;
  
  puVar1 = state->end;
  uStack_80 = 0x12e25b;
  uVar8 = ptls_decode_quicint(&state->src,puVar1);
  iVar7 = 0x20007;
  if (uVar8 == 0xffffffffffffffff) {
    bVar4 = false;
    cid = extraout_RDX;
  }
  else {
    uStack_80 = 0x12e275;
    in_R9 = ptls_decode_quicint(&state->src,puVar1);
    cid = extraout_RDX_00;
    if (in_R9 <= uVar8) {
      pbVar2 = state->src;
      in_RCX = (long)puVar1 - (long)pbVar2;
      if (0 < (long)in_RCX) {
        cid = pbVar2 + 1;
        state->src = cid;
        in_RCX = (ulong)*pbVar2;
        if ((byte)(*pbVar2 - 1) < 0x14) {
          in_R8 = cid + in_RCX;
          state->src = in_R8;
          bVar4 = false;
          if (0xf < (long)puVar1 - (long)in_R8) {
            state->src = in_R8 + 0x10;
            bVar4 = true;
            iVar7 = 0;
          }
          goto LAB_0012e2c6;
        }
      }
    }
    bVar4 = false;
  }
LAB_0012e2c6:
  if (bVar4) {
    buf = &local_78;
    if (quicly_trace_fp != (FILE *)0x0) {
      uStack_80 = 0x12e39c;
      num_unregistered_seqs = in_RCX;
      _l = (size_t)in_R8;
      iVar7 = ptls_skip_tracing((conn->crypto).tls);
      sVar6 = num_unregistered_seqs;
      in_RCX = num_unregistered_seqs;
      buf = &local_78;
      in_R8 = (byte *)_l;
      if (iVar7 == 0) {
        unregistered_seqs[3] = (conn->stash).now;
        lVar3 = -(num_unregistered_seqs * 2 + 0x10 & 0xfffffffffffffff0);
        *(undefined8 *)((long)&uStack_80 + lVar3) = 0x12e3dd;
        pcVar9 = ptls_hexdump((char *)((long)unregistered_seqs + lVar3 + -8),cid,sVar6);
        sVar6 = _l;
        buf = (uint64_t *)(acStack_a8 + lVar3);
        *(undefined8 *)((long)auStack_c0 + lVar3 + 0x10) = 0x12e3f7;
        pcVar10 = ptls_hexdump((char *)buf,(void *)sVar6,0x10);
        uVar5 = unregistered_seqs[3];
        if (conn == (quicly_conn_t *)0x0) {
          uVar11 = 0;
        }
        else {
          uVar11 = (ulong)(conn->super).local.cid_set.plaintext.master_id;
        }
        *(char **)((long)auStack_c0 + lVar3 + 0x10) = pcVar10;
        *(char **)((long)auStack_c0 + lVar3 + 8) = pcVar9;
        *(undefined8 *)((long)auStack_c0 + lVar3) = 0x12e427;
        fprintf((FILE *)quicly_trace_fp,
                "{\"type\":\"new-connection-id-receive\", \"conn\":%u, \"time\":%lld, \"sequence\":%llu, \"retire-prior-to\":%llu, \"cid\":\"%s\", \"stateless-reset-token\":\"%s\"}\n"
                ,uVar11,uVar5,uVar8,in_R9);
        in_RCX = num_unregistered_seqs;
        in_R8 = (byte *)_l;
      }
    }
    if (uVar8 < (conn->super).remote.largest_retire_prior_to) {
      *(char *)((long)buf + -8) = -8;
      *(char *)((long)buf + -7) = -0x1e;
      *(char *)((long)buf + -6) = '\x12';
      *(char *)((long)buf + -5) = '\0';
      *(char *)((long)buf + -4) = '\0';
      *(char *)((long)buf + -3) = '\0';
      *(char *)((long)buf + -2) = '\0';
      *(char *)((long)buf + -1) = '\0';
      quicly_retire_cid_push(&(conn->egress).retire_cid,uVar8);
      puVar1 = &(conn->egress).pending_flows;
      *puVar1 = *puVar1 | 0x80;
      iVar7 = 0;
    }
    else {
      *(ulong **)((long)buf + -8) = &local_48;
      *(uint64_t **)((long)buf + -0x10) = &local_78;
      *(char *)((long)buf + -0x18) = '!';
      *(char *)((long)buf + -0x17) = -0x1d;
      *(char *)((long)buf + -0x16) = '\x12';
      *(char *)((long)buf + -0x15) = '\0';
      *(char *)((long)buf + -0x14) = '\0';
      *(char *)((long)buf + -0x13) = '\0';
      *(char *)((long)buf + -0x12) = '\0';
      *(char *)((long)buf + -0x11) = '\0';
      iVar7 = quicly_remote_cid_register
                        (&(conn->super).remote.cid_set,uVar8,cid,in_RCX,in_R8,in_R9,
                         *(uint64_t **)((long)buf + -0x10),*(size_t **)((long)buf + -8));
      if (iVar7 == 0) {
        if (local_48 != 0) {
          uVar11 = 0;
          do {
            uVar8 = unregistered_seqs[uVar11 - 1];
            *(char *)((long)buf + -8) = 'M';
            *(char *)((long)buf + -7) = -0x1d;
            *(char *)((long)buf + -6) = '\x12';
            *(char *)((long)buf + -5) = '\0';
            *(char *)((long)buf + -4) = '\0';
            *(char *)((long)buf + -3) = '\0';
            *(char *)((long)buf + -2) = '\0';
            *(char *)((long)buf + -1) = '\0';
            quicly_retire_cid_push(&(conn->egress).retire_cid,uVar8);
            puVar1 = &(conn->egress).pending_flows;
            *puVar1 = *puVar1 | 0x80;
            uVar11 = uVar11 + 1;
          } while (uVar11 < local_48);
        }
        iVar7 = 0;
        if ((conn->super).remote.largest_retire_prior_to < in_R9) {
          (conn->super).remote.largest_retire_prior_to = in_R9;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int handle_new_connection_id_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret;
    quicly_new_connection_id_frame_t frame;

    /* TODO: return error when using zero-length CID */

    if ((ret = quicly_decode_new_connection_id_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(NEW_CONNECTION_ID_RECEIVE, conn, conn->stash.now, frame.sequence, frame.retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(frame.cid.base, frame.cid.len),
                 QUICLY_PROBE_HEXDUMP(frame.stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    if (frame.sequence < conn->super.remote.largest_retire_prior_to) {
        /* An endpoint that receives a NEW_CONNECTION_ID frame with a sequence number smaller than the Retire Prior To
         * field of a previously received NEW_CONNECTION_ID frame MUST send a corresponding RETIRE_CONNECTION_ID frame
         * that retires the newly received connection ID, unless it has already done so for that sequence number. (19.15)
         * TODO: "unless ..." part may not be properly addressed here (we may already have sent the RCID frame for this
         * sequence) */
        schedule_retire_connection_id_frame(conn, frame.sequence);
        /* do not install this CID */
        return 0;
    }

    uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT];
    size_t num_unregistered_seqs;
    if ((ret = quicly_remote_cid_register(&conn->super.remote.cid_set, frame.sequence, frame.cid.base, frame.cid.len,
                                          frame.stateless_reset_token, frame.retire_prior_to, unregistered_seqs,
                                          &num_unregistered_seqs)) != 0)
        return ret;

    for (size_t i = 0; i < num_unregistered_seqs; i++)
        schedule_retire_connection_id_frame(conn, unregistered_seqs[i]);

    if (frame.retire_prior_to > conn->super.remote.largest_retire_prior_to)
        conn->super.remote.largest_retire_prior_to = frame.retire_prior_to;

    return 0;
}